

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O3

void proto2_unittest::TestCamelCaseFieldNames::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  ulong uVar1;
  _func_int **pp_Var2;
  Arena *extraout_RDX;
  Arena *pAVar3;
  uint unaff_EBP;
  string *value;
  MessageLite *pMVar4;
  Arena *arena;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    value = (string *)to_msg;
    pMVar4 = from_msg;
    MergeImpl();
    pAVar3 = extraout_RDX;
LAB_00c99f15:
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
LAB_00c99e04:
    google::protobuf::internal::ArenaStringPtr::Set<>((ArenaStringPtr *)pMVar4,value,pAVar3);
  }
  else {
    google::protobuf::RepeatedField<int>::MergeFrom
              ((RepeatedField<int> *)&to_msg[1]._internal_metadata_,
               (RepeatedField<int> *)&from_msg[1]._internal_metadata_);
    if (*(int *)&from_msg[3]._vptr_MessageLite != 0) {
      google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
                ((RepeatedPtrFieldBase *)&to_msg[2]._internal_metadata_,
                 (RepeatedPtrFieldBase *)&from_msg[2]._internal_metadata_);
    }
    google::protobuf::RepeatedField<int>::MergeFrom
              ((RepeatedField<int> *)(to_msg + 4),(RepeatedField<int> *)(from_msg + 4));
    if ((int)from_msg[5]._internal_metadata_.ptr_ != 0) {
      google::protobuf::internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)(to_msg + 5),(RepeatedPtrFieldBase *)(from_msg + 5),
                 google::protobuf::Arena::CopyConstruct<proto2_unittest::ForeignMessage>);
    }
    if (*(int *)&from_msg[7]._vptr_MessageLite != 0) {
      google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
                ((RepeatedPtrFieldBase *)&to_msg[6]._internal_metadata_,
                 (RepeatedPtrFieldBase *)&from_msg[6]._internal_metadata_);
    }
    if ((int)from_msg[8]._internal_metadata_.ptr_ != 0) {
      google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
                ((RepeatedPtrFieldBase *)(to_msg + 8),(RepeatedPtrFieldBase *)(from_msg + 8));
    }
    unaff_EBP = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((unaff_EBP & 0x3f) == 0) goto LAB_00c99ec3;
    if ((unaff_EBP & 1) != 0) {
      uVar1 = from_msg[9]._internal_metadata_.ptr_;
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
      value = (string *)(uVar1 & 0xfffffffffffffffc);
      pMVar4 = (MessageLite *)&to_msg[9]._internal_metadata_;
      pAVar3 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar3 & 1) != 0) goto LAB_00c99f15;
      goto LAB_00c99e04;
    }
  }
  if ((unaff_EBP & 2) != 0) {
    pp_Var2 = from_msg[10]._vptr_MessageLite;
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 2;
    pAVar3 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar3 & 1) != 0) {
      pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
    }
    google::protobuf::internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)(to_msg + 10),(string *)((ulong)pp_Var2 & 0xfffffffffffffffc),
               pAVar3);
  }
  if ((unaff_EBP & 4) != 0) {
    uVar1 = from_msg[10]._internal_metadata_.ptr_;
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 4;
    pAVar3 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar3 & 1) != 0) {
      pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
    }
    google::protobuf::internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)&to_msg[10]._internal_metadata_,
               (string *)(uVar1 & 0xfffffffffffffffc),pAVar3);
  }
  if ((unaff_EBP & 8) != 0) {
    pMVar4 = (MessageLite *)from_msg[0xb]._vptr_MessageLite;
    if (pMVar4 == (MessageLite *)0x0) {
      MergeImpl((TestCamelCaseFieldNames *)&stack0xffffffffffffffd0);
    }
    if ((MessageLite *)to_msg[0xb]._vptr_MessageLite == (MessageLite *)0x0) {
      pp_Var2 = (_func_int **)
                google::protobuf::Arena::CopyConstruct<proto2_unittest::ForeignMessage>
                          (arena,pMVar4);
      to_msg[0xb]._vptr_MessageLite = pp_Var2;
    }
    else {
      ForeignMessage::MergeImpl((MessageLite *)to_msg[0xb]._vptr_MessageLite,pMVar4);
    }
  }
  if ((unaff_EBP & 0x10) != 0) {
    *(int *)&to_msg[0xb]._internal_metadata_.ptr_ = (int)from_msg[0xb]._internal_metadata_.ptr_;
  }
  if ((unaff_EBP & 0x20) != 0) {
    *(undefined4 *)((long)&to_msg[0xb]._internal_metadata_.ptr_ + 4) =
         *(undefined4 *)((long)&from_msg[0xb]._internal_metadata_.ptr_ + 4);
  }
LAB_00c99ec3:
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | unaff_EBP;
  uVar1 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar1 & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void TestCamelCaseFieldNames::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestCamelCaseFieldNames*>(&to_msg);
  auto& from = static_cast<const TestCamelCaseFieldNames&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestCamelCaseFieldNames)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeatedprimitivefield()->MergeFrom(from._internal_repeatedprimitivefield());
  _this->_internal_mutable_repeatedstringfield()->MergeFrom(from._internal_repeatedstringfield());
  _this->_internal_mutable_repeatedenumfield()->MergeFrom(from._internal_repeatedenumfield());
  _this->_internal_mutable_repeatedmessagefield()->MergeFrom(
      from._internal_repeatedmessagefield());
  _this->_internal_mutable_repeatedstringpiecefield()->MergeFrom(from._internal_repeatedstringpiecefield());
  _this->_internal_mutable_repeatedcordfield()->MergeFrom(from._internal_repeatedcordfield());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_stringfield(from._internal_stringfield());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_stringpiecefield(from._internal_stringpiecefield());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_cordfield(from._internal_cordfield());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(from._impl_.messagefield_ != nullptr);
      if (_this->_impl_.messagefield_ == nullptr) {
        _this->_impl_.messagefield_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.messagefield_);
      } else {
        _this->_impl_.messagefield_->MergeFrom(*from._impl_.messagefield_);
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.primitivefield_ = from._impl_.primitivefield_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.enumfield_ = from._impl_.enumfield_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}